

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O1

HostFew<Omega_h::Read<signed_char>,_4> *
Omega_h::mark_dead_ents
          (HostFew<Omega_h::Read<signed_char>,_4> *__return_storage_ptr__,Mesh *mesh,
          LOs *rails2edges,Read<signed_char> *rail_col_dirs)

{
  int *piVar1;
  Alloc *pAVar2;
  bool bVar3;
  LO LVar4;
  uint uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  char *__end;
  Write<signed_char> *dead_cells;
  HostFew<Omega_h::Write<signed_char>,_4> writes;
  string local_108;
  Write<signed_char> local_e8;
  LOs *local_d8;
  Write<signed_char> local_d0;
  Read<signed_char> local_c0;
  LOs local_b0;
  LOs local_a0;
  Read<signed_char> *local_90;
  Read<signed_char> local_88;
  Write<signed_char> local_78;
  Alloc *local_68;
  void *pvStack_60;
  ulong local_58 [5];
  
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_68 = (Alloc *)0x0;
  pvStack_60 = (void *)0x0;
  local_78.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.shared_alloc_.direct_ptr = (void *)0x0;
  local_a0.write_.shared_alloc_.alloc = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a0.write_.shared_alloc_.alloc)->use_count =
           (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = (rails2edges->write_).shared_alloc_.direct_ptr;
  local_d8 = rails2edges;
  LVar4 = Mesh::nedges(mesh);
  mark_image((Omega_h *)&local_88,&local_a0,LVar4);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  local_90 = rail_col_dirs;
  deep_copy<signed_char>((Omega_h *)&local_e8,&local_88,&local_108);
  pAVar2 = local_68;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    piVar1 = &local_68->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68);
      operator_delete(pAVar2,0x48);
    }
  }
  local_68 = local_e8.shared_alloc_.alloc;
  pvStack_60 = local_e8.shared_alloc_.direct_ptr;
  if ((((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
       local_e8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + -1;
    local_68 = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_e8.shared_alloc_.alloc = (Alloc *)0x0;
  local_e8.shared_alloc_.direct_ptr = (void *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(local_88.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  uVar5 = mesh->dim_;
  if (uVar5 < 4) {
    uVar6 = 2;
    puVar7 = local_58;
    do {
      uVar8 = (ulong)uVar5;
      if (uVar8 < uVar6) {
        if (1 < (int)uVar5) {
          dead_cells = &local_78 + uVar8;
          do {
            local_b0.write_.shared_alloc_.alloc = (local_d8->write_).shared_alloc_.alloc;
            if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
                local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_b0.write_.shared_alloc_.alloc =
                     (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (local_b0.write_.shared_alloc_.alloc)->use_count =
                     (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_b0.write_.shared_alloc_.direct_ptr = (local_d8->write_).shared_alloc_.direct_ptr;
            local_c0.write_.shared_alloc_.alloc = (local_90->write_).shared_alloc_.alloc;
            if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
                local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_c0.write_.shared_alloc_.alloc =
                     (Alloc *)((local_c0.write_.shared_alloc_.alloc)->size * 8 + 1);
              }
              else {
                (local_c0.write_.shared_alloc_.alloc)->use_count =
                     (local_c0.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_c0.write_.shared_alloc_.direct_ptr = (local_90->write_).shared_alloc_.direct_ptr;
            mark_dead_ents(mesh,&local_b0,&local_c0,(Int)uVar8,dead_cells,dead_cells + -1);
            pAVar2 = local_c0.write_.shared_alloc_.alloc;
            if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
                local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
            pAVar2 = local_b0.write_.shared_alloc_.alloc;
            if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
                local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
                operator_delete(pAVar2,0x48);
              }
            }
            bVar3 = 2 < (long)uVar8;
            uVar8 = uVar8 - 1;
            dead_cells = dead_cells + -1;
          } while (bVar3);
        }
        __return_storage_ptr__->array_[3].write_.shared_alloc_.alloc = (Alloc *)0x0;
        __return_storage_ptr__->array_[3].write_.shared_alloc_.direct_ptr = (void *)0x0;
        __return_storage_ptr__->array_[2].write_.shared_alloc_.alloc = (Alloc *)0x0;
        __return_storage_ptr__->array_[2].write_.shared_alloc_.direct_ptr = (void *)0x0;
        __return_storage_ptr__->array_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
        __return_storage_ptr__->array_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
        __return_storage_ptr__->array_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
        __return_storage_ptr__->array_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
        lVar9 = 0;
        do {
          local_d0.shared_alloc_.alloc = *(Alloc **)((long)&local_78.shared_alloc_.alloc + lVar9);
          if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 &&
              local_d0.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_d0.shared_alloc_.alloc = (Alloc *)((local_d0.shared_alloc_.alloc)->size * 8 + 1)
              ;
            }
            else {
              (local_d0.shared_alloc_.alloc)->use_count =
                   (local_d0.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_d0.shared_alloc_.direct_ptr =
               *(void **)((long)&local_78.shared_alloc_.direct_ptr + lVar9);
          Read<signed_char>::Read((Read<signed_char> *)&local_108,&local_d0);
          pAVar2 = *(Alloc **)
                    ((long)&__return_storage_ptr__->array_[0].write_.shared_alloc_.alloc + lVar9);
          if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
            piVar1 = &pAVar2->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar2);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_d0.shared_alloc_.alloc;
          *(pointer *)((long)&__return_storage_ptr__->array_[0].write_.shared_alloc_.alloc + lVar9)
               = local_108._M_dataplus._M_p;
          *(size_type *)
           ((long)&__return_storage_ptr__->array_[0].write_.shared_alloc_.direct_ptr + lVar9) =
               local_108._M_string_length;
          if ((((ulong)local_108._M_dataplus._M_p & 7) == 0 &&
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_108._M_dataplus._M_p !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) && (entering_parallel == '\x01')) {
            *(int *)(local_108._M_dataplus._M_p + 0x30) =
                 (int)*(long *)(local_108._M_dataplus._M_p + 0x30) + -1;
            *(size_type *)
             ((long)&__return_storage_ptr__->array_[0].write_.shared_alloc_.alloc + lVar9) =
                 *(size_type *)local_108._M_dataplus._M_p * 8 + 1;
          }
          local_108._M_dataplus._M_p = (pointer)0x0;
          local_108._M_string_length = 0;
          if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 &&
              local_d0.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_d0.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_d0.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x40);
        lVar9 = 0x40;
        do {
          pAVar2 = *(Alloc **)((long)&local_88.write_.shared_alloc_.alloc + lVar9);
          if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
            piVar1 = &pAVar2->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar2);
              operator_delete(pAVar2,0x48);
            }
          }
          lVar9 = lVar9 + -0x10;
        } while (lVar9 != 0);
        return __return_storage_ptr__;
      }
      LVar4 = Mesh::nents(mesh,(Int)uVar6);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"","");
      Write<signed_char>::Write(&local_e8,LVar4,'\0',&local_108);
      pAVar2 = (Alloc *)*puVar7;
      if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
        piVar1 = &pAVar2->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar2);
          operator_delete(pAVar2,0x48);
        }
      }
      *puVar7 = (ulong)local_e8.shared_alloc_.alloc;
      puVar7[1] = (ulong)local_e8.shared_alloc_.direct_ptr;
      if ((((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
           local_e8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + -1;
        *puVar7 = (local_e8.shared_alloc_.alloc)->size * 8 + 1;
      }
      local_e8.shared_alloc_.alloc = (Alloc *)0x0;
      local_e8.shared_alloc_.direct_ptr = (void *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      uVar5 = mesh->dim_;
      puVar7 = puVar7 + 2;
    } while (uVar5 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

HostFew<Read<I8>, 4> mark_dead_ents(
    Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs) {
  HostFew<Write<I8>, 4> writes;
  writes[EDGE] = deep_copy(mark_image(rails2edges, mesh->nedges()));
  for (Int dim = Int(EDGE) + 1; dim <= mesh->dim(); ++dim)
    writes[dim] = Write<I8>(mesh->nents(dim), 0);
  for (Int dim = mesh->dim(); dim > EDGE; --dim)
    mark_dead_ents(
        mesh, rails2edges, rail_col_dirs, dim, writes[dim], writes[dim - 1]);
  HostFew<Read<I8>, 4> reads;
  for (Int dim = 0; dim < 4; ++dim) reads[dim] = writes[dim];
  return reads;
}